

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Reals __thiscall Omega_h::interpolate_between(Omega_h *this,Reals *a,Reals *b,Real t)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  ulong uVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  long lVar7;
  IntIterator last;
  int size_in;
  size_t sVar8;
  Reals RVar9;
  Write<double> out;
  type f;
  Write<double> local_f8;
  Write<double> local_e8;
  undefined1 local_d8 [32];
  Real local_b8;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc *local_90;
  void *local_88;
  Real local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  void *pvStack_60;
  Alloc *local_58;
  void *pvStack_50;
  Real local_48;
  Alloc *local_40;
  void *pvStack_38;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar5 = pAVar3->size;
  }
  else {
    uVar5 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar4 >> 3) == (int)(uVar5 >> 3)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar8 = pAVar2->size;
    }
    else {
      sVar8 = (ulong)pAVar2 >> 3;
    }
    local_d8._0_8_ = (Alloc *)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
    size_in = (int)(sVar8 >> 3);
    Write<double>::Write(&local_f8,size_in,(string *)local_d8);
    if ((Alloc *)local_d8._0_8_ != (Alloc *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
    local_a0 = local_f8.shared_alloc_.alloc;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0 = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_98 = local_f8.shared_alloc_.direct_ptr;
    local_90 = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90 = (Alloc *)(local_90->size * 8 + 1);
      }
      else {
        local_90->use_count = local_90->use_count + 1;
      }
    }
    local_88 = (a->write_).shared_alloc_.direct_ptr;
    local_78 = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    local_70 = (b->write_).shared_alloc_.direct_ptr;
    local_68 = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(local_a0->size * 8 + 1);
      }
      else {
        local_a0->use_count = local_a0->use_count + 1;
      }
    }
    pvStack_60 = local_f8.shared_alloc_.direct_ptr;
    local_58 = local_90;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58 = (Alloc *)(local_90->size * 8 + 1);
      }
      else {
        local_90->use_count = local_90->use_count + 1;
      }
    }
    local_40 = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    local_80 = t;
    pvStack_50 = local_88;
    local_48 = t;
    pvStack_38 = local_70;
    if (0 < size_in) {
      local_d8._0_8_ = local_68;
      local_d8._8_8_ = local_f8.shared_alloc_.direct_ptr;
      if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
        local_68->use_count = local_68->use_count + -1;
        local_d8._0_8_ = local_68->size * 8 + 1;
      }
      local_68 = (Alloc *)0x0;
      pvStack_60 = (void *)0x0;
      local_d8._16_8_ = local_58;
      if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
        local_58->use_count = local_58->use_count + -1;
        local_d8._16_8_ = local_58->size * 8 + 1;
      }
      local_58 = (Alloc *)0x0;
      pvStack_50 = (void *)0x0;
      local_b0 = local_40;
      if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
        local_40->use_count = local_40->use_count + -1;
        local_b0 = (Alloc *)(local_40->size * 8 + 1);
      }
      local_40 = (Alloc *)0x0;
      pvStack_38 = (void *)0x0;
      entering_parallel = '\0';
      lVar7 = 0;
      do {
        *(double *)((long)local_f8.shared_alloc_.direct_ptr + lVar7 * 8) =
             *(double *)((long)local_88 + lVar7 * 8) * (1.0 - t) +
             *(double *)((long)local_70 + lVar7 * 8) * t;
        lVar7 = lVar7 + 1;
      } while (size_in != (int)lVar7);
      local_d8._24_8_ = local_88;
      local_b8 = t;
      local_a8 = local_70;
      interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
                ((__0 *)local_d8);
    }
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_68);
    local_e8.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
    local_e8.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
    if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
         local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
      local_e8.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_f8.shared_alloc_.alloc = (Alloc *)0x0;
    local_f8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_e8);
    pAVar2 = local_e8.shared_alloc_.alloc;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_a0);
    pAVar2 = local_f8.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    RVar9.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x238);
}

Assistant:

Reals interpolate_between(Reals a, Reals b, Real t) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto n = a.size();
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = a[i] * (1.0 - t) + b[i] * t; };
  parallel_for(n, f, "interpolate_between");
  return out;
}